

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

void __thiscall
QUnicodeTools::initCharAttributes
          (QUnicodeTools *this,QStringView string,ScriptItem *items,qsizetype numItems,
          QCharAttributes *attributes,CharAttributeOptions options)

{
  byte bVar1;
  ushort uVar2;
  LineBreakClass LVar3;
  bool bVar4;
  State SVar5;
  uint uVar6;
  State state;
  uint uVar7;
  Properties *pPVar8;
  byte *pbVar9;
  Properties *pPVar10;
  ulong uVar11;
  QUnicodeTools *pQVar12;
  uint uVar13;
  uint uVar14;
  QUnicodeTools *pQVar15;
  State SVar16;
  anon_class_4_1_a85b8a8a_for__M_pred __pred;
  QUnicodeTools *pQVar17;
  anon_class_4_1_898e463c_for__M_pred __pred_00;
  ulong uVar18;
  long lVar19;
  char32_t cVar20;
  char32_t ucs4;
  QUnicodeTools *pQVar21;
  LinebreakUnit lb;
  long lVar22;
  storage_type_conflict *psVar23;
  QUnicodeTools *pQVar24;
  char cVar25;
  ScriptItem *pSVar26;
  int iVar27;
  qsizetype pos;
  ulong uVar28;
  long in_FS_OFFSET;
  uint local_ec;
  uint local_dc;
  Properties *local_b8;
  QUnicodeTools *local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  LineBreakClass local_3c;
  long local_38;
  
  lVar19 = string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)this < 1) goto LAB_0033dae5;
  if (((uint)attributes >> 0xc & 1) == 0) {
    memset((void *)numItems,0,(size_t)(this + 1));
  }
  if (((ulong)attributes & 1) != 0) {
    cVar25 = '\0';
    pQVar21 = (QUnicodeTools *)0x0;
    uVar7 = 2;
    do {
      uVar2 = *(ushort *)(lVar19 + (long)pQVar21 * 2);
      cVar20 = (char32_t)uVar2;
      pQVar12 = pQVar21;
      if ((((cVar20 & 0xfc00U) == 0xd800) && (pQVar21 + 1 != this)) &&
         (uVar13 = (uint)*(ushort *)(lVar19 + 2 + (long)pQVar21 * 2), (uVar13 & 0xfc00) == 0xdc00))
      {
        cVar20 = (uint)uVar2 * 0x400 + uVar13 + L'\xfca02400';
        pQVar12 = pQVar21 + 1;
      }
      pPVar8 = QUnicodeTables::properties(cVar20);
      uVar13 = *(uint *)&pPVar8->field_0x10 & 0x1f;
      if (cVar25 == '\x03') {
        cVar25 = '\0';
        if (uVar13 != 6) goto LAB_0033cdaa;
      }
      else {
        if (cVar25 == '\x02') {
          cVar25 = '\0';
          if (uVar13 == 0xe) goto LAB_0033cddd;
LAB_0033cdaa:
          if (uVar7 == 0xe) {
            if (uVar13 == 4) {
LAB_0033cdcc:
              cVar25 = '\x01';
            }
            else if (uVar13 == 5) goto LAB_0033cdba;
          }
          else if (uVar13 == 6) {
            cVar25 = '\x03';
          }
        }
        else {
          if (cVar25 != '\x01') goto LAB_0033cdaa;
          if (uVar13 == 4) goto LAB_0033cdcc;
          if (uVar13 != 5) {
            cVar25 = '\0';
            goto LAB_0033cdaa;
          }
LAB_0033cdba:
          cVar25 = '\x02';
        }
        if ((1 << (sbyte)uVar13 & (uint)*(ushort *)(GB::breakTable + (ulong)uVar7 * 2)) == 0) {
          pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] | 1);
        }
      }
LAB_0033cddd:
      pQVar21 = pQVar12 + 1;
      uVar7 = uVar13;
    } while (pQVar21 != this);
    this[numItems] = (QUnicodeTools)((byte)this[numItems] | 1);
  }
  if (((ulong)attributes & 2) != 0) {
    initCharAttributes();
  }
  if (((ulong)attributes & 4) != 0) {
    uVar18 = 0xb;
    pQVar21 = (QUnicodeTools *)0x0;
    do {
      uVar2 = *(ushort *)(lVar19 + (long)pQVar21 * 2);
      cVar20 = (char32_t)uVar2;
      pQVar12 = pQVar21;
      if ((((cVar20 & 0xfc00U) == 0xd800) && (pQVar21 + 1 != this)) &&
         (uVar7 = (uint)*(ushort *)(lVar19 + 2 + (long)pQVar21 * 2), (uVar7 & 0xfc00) == 0xdc00)) {
        cVar20 = (uint)uVar2 * 0x400 + uVar7 + L'\xfca02400';
        pQVar12 = pQVar21 + 1;
      }
      pPVar8 = QUnicodeTables::properties(cVar20);
      uVar28 = (ulong)(*(ushort *)&pPVar8->field_0x12 & 0xf);
      bVar1 = SB::breakTable[uVar28 + (ulong)(uint)((int)uVar18 << 4) + uVar18 * -2];
      uVar18 = (ulong)bVar1;
      pQVar24 = pQVar12;
      if (bVar1 == 0xd) {
        do {
          pQVar17 = pQVar24 + 1;
          if ((long)this <= (long)pQVar17) goto LAB_0033cf4b;
          uVar2 = *(ushort *)(lVar19 + (long)pQVar17 * 2);
          cVar20 = (char32_t)uVar2;
          if ((((cVar20 & 0xfc00U) == 0xd800) && (pQVar24 + 2 != this)) &&
             (uVar7 = (uint)*(ushort *)(lVar19 + 4 + (long)pQVar24 * 2), (uVar7 & 0xfc00) == 0xdc00)
             ) {
            cVar20 = (uint)uVar2 * 0x400 + uVar7 + L'\xfca02400';
            pQVar17 = pQVar24 + 2;
          }
          pPVar8 = QUnicodeTables::properties(cVar20);
          uVar7 = *(ushort *)&pPVar8->field_0x12 & 0xf;
          if (0xd < uVar7) goto LAB_0033cf4b;
          pQVar24 = pQVar17;
        } while ((0x2a31U >> uVar7 & 1) != 0);
        if (uVar7 != 6) goto LAB_0033cf4b;
        uVar18 = 0;
      }
      else {
        pQVar17 = pQVar12;
        if (bVar1 == 0xc) {
LAB_0033cf4b:
          pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] | 4);
          uVar18 = (ulong)(byte)SB::breakTable[uVar28];
          pQVar17 = pQVar12;
        }
      }
      pQVar21 = pQVar17 + 1;
    } while (pQVar21 != this);
    this[numItems] = (QUnicodeTools)((byte)this[numItems] | 4);
  }
  if (((ulong)attributes & 8) != 0) {
    local_b8 = QUnicodeTables::properties(L'\n');
    uVar18 = 0x30;
    local_dc = 0;
    uVar7 = 0;
    local_ec = 0x30;
    pQVar12 = (QUnicodeTools *)0x0;
    local_b0 = (QUnicodeTools *)0x0;
    state = None;
    pQVar21 = (QUnicodeTools *)0x0;
LAB_0033cfc9:
    uVar2 = *(ushort *)(lVar19 + (long)pQVar12 * 2);
    cVar20 = (char32_t)uVar2;
    pQVar24 = pQVar12;
    if ((((uVar2 & 0xfc00) == 0xd800) && (pQVar12 + 1 != this)) &&
       (uVar13 = (uint)*(ushort *)(lVar19 + 2 + (long)pQVar12 * 2), (uVar13 & 0xfc00) == 0xdc00)) {
      cVar20 = (uint)uVar2 * 0x400 + uVar13 + L'\xfca02400';
      pQVar24 = pQVar12 + 1;
    }
    pPVar8 = QUnicodeTables::properties(cVar20);
    uVar13 = *(uint *)&pPVar8->field_0x10 >> 10 & 0x3f;
    __pred_00.lcls = (LineBreakClass)uVar18;
    if ((((ulong)attributes & 0x20) == 0) ||
       ((uVar28 = 0xf, 4 < uVar13 - 0x1d &&
        ((0x5f < (uint)(cVar20 + L'\xffffced0') || (uVar13 != 0x11)))))) {
      if (uVar13 == 3) {
        if ((*(uint *)pPVar8 & 0x1f) == 0x18) {
          __pred.nncls = LineBreak_LF;
          if ((long)(pQVar24 + 1) < (long)this) {
            uVar2 = *(ushort *)(lVar19 + 2 + (long)pQVar24 * 2);
            ucs4 = (char32_t)uVar2;
            if ((((ucs4 & 0xfc00U) == 0xd800) && ((long)(pQVar24 + 2) < (long)this)) &&
               (uVar13 = (uint)*(ushort *)(lVar19 + 4 + (long)pQVar24 * 2),
               (uVar13 & 0xfc00) == 0xdc00)) {
              ucs4 = (uint)uVar2 * 0x400 + uVar13 + L'\xfca02400';
            }
            pPVar10 = QUnicodeTables::properties(ucs4);
            __pred.nncls = *(uint *)&pPVar10->field_0x10 >> 10 & (LineBreak_LF|LineBreak_AL);
          }
          local_78 = 0x70000002e;
          uStack_70 = 0x10000001c;
          local_68 = 0x400000003;
          uStack_60 = 0x200000005;
          local_58 = 0xb00000009;
          uStack_50 = 0x310000000a;
          local_48 = 0x300000002f;
          local_40 = 0x1a;
          bVar4 = std::
                  any_of<QUnicodeTables::LineBreakClass_const*,QUnicodeTools::getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)::__2>
                            ((LineBreakClass *)&local_78,&local_3c,__pred);
          uVar28 = (ulong)((uint)bVar4 * 2 + 3);
        }
        else {
          uVar28 = 3;
          if ((*(uint *)pPVar8 & 0x1f) == 0x17) {
            local_78 = 0x2f00000031;
            uStack_70 = 0x30;
            local_68 = 0x400000003;
            uStack_60 = 0x700000005;
            local_58 = 0x1a0000002e;
            bVar4 = std::
                    any_of<QUnicodeTables::LineBreakClass_const*,QUnicodeTools::getLineBreaks(char16_t_const*,long_long,QCharAttributes*,QFlags<QUnicodeTools::CharAttributeOption>)::__1>
                              ((LineBreakClass *)&local_78,(LineBreakClass *)&uStack_50,__pred_00);
            uVar28 = (ulong)(bVar4 + 3);
          }
        }
      }
      else {
        uVar28 = (ulong)uVar13;
        if ((uVar13 == 0x2c) &&
           (uVar28 = 0x2c,
           (undefined1  [20])((undefined1  [20])*pPVar8 & (undefined1  [20])0x1e) ==
           (undefined1  [20])0x0)) {
          uVar28 = 0x1b;
        }
      }
    }
    if (((LineBreak_SG < __pred_00.lcls) ||
        ((__pred_00.lcls < LineBreak_EB && ((0x804000080U >> uVar18 & 1) != 0)))) &&
       ((cVar20 == L'‐' || ((int)uVar28 == 0x13)))) {
      uVar28 = (ulong)((uint)(cVar20 == L'‐') * 2 + 0x14);
    }
    pQVar17 = pQVar21;
    if ((local_ec != 0x27) || (cVar20 != L'◌')) {
      iVar27 = (int)uVar28;
      lb = (LinebreakUnit)(((ulong)(uint)cVar20 << 0x20) + uVar28);
      SVar5 = LB::BRS::updateState(state,lb);
      if (SVar5 != state) {
        pQVar15 = pQVar12 + -1;
        LVar3 = lb.lbc;
        SVar16 = (uint)((LVar3 - LineBreak_AK & 0xfffffffd) == 0) * 5;
        state = SVar5;
        if (lb.ucs4 == L'◌') {
          SVar16 = LB28a_4;
        }
LAB_0033d5d1:
        do {
          switch(state) {
          case Start:
            local_b0 = pQVar24;
            goto switchD_0033d5f0_caseD_5;
          case LB28a_2VF:
          case LB28a_3VIAK:
          case LB28a_4VF:
            pQVar21 = local_b0 + 1;
            if ((long)pQVar21 < (long)pQVar24) {
              do {
                pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] & 0xf7);
                pQVar21 = pQVar21 + 1;
              } while (pQVar24 != pQVar21);
            }
            bVar4 = state == LB28a_3VIAK;
            state = (State)bVar4;
            if (bVar4) {
              local_b0 = pQVar24;
            }
            goto switchD_0033d462_default;
          case LB28a_2VI:
            pQVar21 = local_b0 + 1;
            if ((long)pQVar21 < (long)pQVar24) {
              state = LB28a_2VI;
              do {
                pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] & 0xf7);
                pQVar21 = pQVar21 + 1;
                local_b0 = pQVar24;
              } while (pQVar24 != pQVar21);
            }
            else {
              state = LB28a_2VI;
              local_b0 = pQVar24;
            }
            goto switchD_0033d462_default;
          default:
            goto switchD_0033d5f0_caseD_5;
          case Restart:
            local_b0 = pQVar15;
            if (LVar3 != LineBreak_VI) goto code_r0x0033d5f9;
            state = LB28a_2VI;
          }
        } while( true );
      }
      goto switchD_0033d5f0_caseD_5;
    }
    local_ec = 0x27;
    goto switchD_0033d462_default;
  }
  goto LAB_0033da68;
code_r0x0033d5f9:
  state = LB28a_2VF;
  if ((LVar3 == LineBreak_VF) || (state = SVar16, LVar3 != LineBreak_CM)) goto LAB_0033d5d1;
  state = Start;
switchD_0033d5f0_caseD_5:
  if (iVar27 == 0xb) {
    lVar22 = 6;
    if (__pred_00.lcls == LineBreak_SP) {
      if ((long)(pQVar24 + 1) < (long)this) {
        uVar2 = *(ushort *)(lVar19 + 2 + (long)pQVar24 * 2);
        cVar20 = (char32_t)uVar2;
        if ((((cVar20 & 0xfc00U) == 0xd800) && ((long)(pQVar24 + 2) < (long)this)) &&
           (uVar13 = (uint)*(ushort *)(lVar19 + 4 + (long)pQVar24 * 2), (uVar13 & 0xfc00) == 0xdc00)
           ) {
          cVar20 = (uint)uVar2 * 0x400 + uVar13 + L'\xfca02400';
        }
        pPVar10 = QUnicodeTables::properties(cVar20);
        if ((*(uint *)&pPVar10->field_0x10 & 0xfc00) == 0x3800) {
          pQVar12[numItems] = (QUnicodeTools)((byte)pQVar12[numItems] | 8);
          uVar18 = 0xb;
          local_ec = 0xb;
          local_b8 = pPVar8;
          goto LAB_0033d93f;
        }
      }
    }
    else if (__pred_00.lcls == LineBreak_HL) goto LAB_0033d73b;
    goto switchD_0033d122_caseD_c;
  }
  if (__pred_00.lcls == LineBreak_HL) {
    if (iVar27 == 0x15) {
      uVar13 = (uint)((ulong)*(undefined8 *)pPVar8 >> 0x35);
      bVar4 = (uVar13 & 7) != 2 && (uVar13 & 3) != 1;
    }
    else {
LAB_0033d73b:
      bVar4 = false;
    }
    uVar18 = 0x17;
    if ((bVar4) || (iVar27 == 0x13)) {
      local_ec = 0x17;
      local_b8 = pPVar8;
      goto LAB_0033d93f;
    }
  }
  lVar22 = 1;
  switch(uVar28) {
  case 0:
    lVar22 = 2;
    break;
  case 1:
  case 2:
    lVar22 = 7;
    break;
  default:
    lVar22 = 0;
    break;
  case 10:
    lVar22 = 5;
    break;
  case 0xb:
    lVar22 = 6;
    break;
  case 0xc:
  case 0xd:
    break;
  case 0xe:
    pbVar9 = LB::NS::actionTable + (ulong)local_dc * 8 + 4;
    uVar13 = 4;
    goto LAB_0033d189;
  case 0x13:
    lVar22 = 3;
  }
switchD_0033d122_caseD_c:
  uVar13 = (uint)lVar22;
  if (uVar7 == 5) {
    local_dc = 0;
    uVar6 = 0;
  }
  else {
    pbVar9 = LB::NS::actionTable + lVar22 + (ulong)local_dc * 8;
LAB_0033d189:
    if (uVar7 == 4) {
      bVar4 = uVar13 == 2;
      uVar14 = 6;
LAB_0033d6dd:
      uVar6 = (uint)(uVar13 == 4) * 2;
      if (bVar4) {
        uVar6 = uVar14;
      }
    }
    else {
      if (uVar7 == 6) {
        bVar4 = uVar13 == 6;
        uVar14 = 5;
        goto LAB_0033d6dd;
      }
      uVar6 = (uint)*pbVar9;
    }
    switch(uVar6) {
    case 0:
      local_dc = 0;
      break;
    case 1:
    case 4:
      pQVar17 = pQVar24;
      local_dc = uVar13;
      if ((uVar7 - 1 < 2) && (pQVar21 = pQVar21 + 1, (long)pQVar21 < (long)pQVar12)) {
        do {
          pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] & 0xf7);
          pQVar21 = pQVar21 + 1;
        } while (pQVar12 != pQVar21);
      }
      break;
    case 2:
    case 5:
    case 6:
      local_dc = uVar13;
      break;
    case 3:
      pQVar21 = pQVar21 + 1;
      local_dc = 0;
      if ((long)pQVar21 < (long)pQVar12) {
        do {
          pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] & 0xf7);
          pQVar21 = pQVar21 + 1;
        } while (pQVar12 != pQVar21);
      }
    }
  }
  uVar7 = uVar6;
  if (iVar27 != 3) {
LAB_0033d315:
    uVar13 = (uint)uVar28;
    if (__pred_00.lcls < LineBreak_CR) {
      if (uVar13 < 0x2e) {
        if ((uVar13 == 6) || (uVar13 == 3)) goto LAB_0033d334;
        goto LAB_0033d343;
      }
      uVar18 = 0x2e;
      if (uVar13 == 0x2e) goto LAB_0033d93f;
    }
    else {
      uVar18 = 0x30;
      if (uVar13 == 0x30 && __pred_00.lcls == LineBreak_CR) {
        local_ec = 0x30;
        local_b8 = pPVar8;
        goto LAB_0033d93f;
      }
      pQVar12[numItems] = (QUnicodeTools)((byte)pQVar12[numItems] | 0x88);
    }
    goto switchD_0033d462_default;
  }
  uVar28 = 3;
  if ((__pred_00.lcls != LineBreak_ZW) && (__pred_00.lcls != LineBreak_SP)) {
    uVar13 = (uint)((ulong)*(undefined8 *)local_b8 >> 0x35) & 7;
    if ((uVar13 < 6) && (((0x26U >> uVar13 & 1) != 0 && (0 < (long)(this + ~(ulong)pQVar24))))) {
      uVar2 = *(ushort *)(lVar19 + 2 + (long)pQVar24 * 2);
      cVar20 = (char32_t)uVar2;
      if ((this + ~(ulong)pQVar24 != (QUnicodeTools *)0x1) &&
         (((cVar20 & 0xfc00U) == 0xd800 &&
          (uVar13 = (uint)*(ushort *)(lVar19 + 4 + (long)pQVar24 * 2), (uVar13 & 0xfc00) == 0xdc00))
         )) {
        cVar20 = (uint)uVar2 * 0x400 + uVar13 + L'\xfca02400';
      }
      pPVar10 = QUnicodeTables::properties(cVar20);
      uVar13 = *(uint *)&pPVar10->field_0x10 >> 10 & 0x3f;
      uVar28 = 3;
      if ((0x2e < uVar13 || uVar13 == 0x1b) ||
         (uVar13 = (uint)((ulong)*(undefined8 *)pPVar10 >> 0x35),
         (uVar13 & 7) == 2 || (uVar13 & 3) == 1)) goto LAB_0033d315;
    }
    uVar28 = 6;
    goto LAB_0033d315;
  }
LAB_0033d334:
  if (((undefined1  [20])*pPVar8 & (undefined1  [20])0x1f) == (undefined1  [20])0x17) {
LAB_0033d343:
    uVar18 = uVar28;
    if ((local_ec != 3) ||
       (((undefined1  [20])*local_b8 & (undefined1  [20])0x1f) == (undefined1  [20])0x18))
    goto LAB_0033d35d;
    uVar18 = 0x1b;
    if ((int)uVar28 != 0x1b) goto LAB_0033d778;
LAB_0033d36c:
    uVar13 = (uint)uVar18;
    if ((__pred_00.lcls != LineBreak_ZW) && (__pred_00.lcls != LineBreak_SP)) goto LAB_0033d93f;
  }
  else {
LAB_0033d778:
    uVar18 = uVar28;
    if ((__pred_00.lcls != LineBreak_SP) && (uVar28 = uVar18, __pred_00.lcls != LineBreak_ZW))
    goto switchD_0033d462_default;
LAB_0033d35d:
    uVar13 = (uint)uVar18;
    if ((uVar13 == 0x2b) || (uVar13 == 0x1b)) goto LAB_0033d36c;
    uVar28 = uVar18;
    if (__pred_00.lcls == LineBreak_ZWJ) goto switchD_0033d462_default;
  }
  if ((__pred_00.lcls == LineBreak_RI) && (uVar13 == 0x22)) {
    uVar18 = 0x2e;
    local_ec = 0x2e;
    local_b8 = pPVar8;
    goto LAB_0033d93f;
  }
  if (((uVar13 == 0x25) &&
      (((undefined1  [20])*local_b8 & (undefined1  [20])0x1f) == (undefined1  [20])0xd)) &&
     ((*(uint *)&local_b8->field_0x10 & 0x1f) == 0xe)) {
    uVar18 = 0x25;
    local_ec = 0x25;
    local_b8 = pPVar8;
    goto LAB_0033d93f;
  }
  if (local_ec < 0x2c) {
    if ((local_ec == 0x2b) || (uVar6 = local_ec, local_ec == 0x1b)) {
      local_b8 = QUnicodeTables::properties(L'A');
      uVar6 = 0xf;
    }
  }
  else {
    local_ec = 0xf;
    uVar6 = 0xf;
  }
  if ((uVar13 == 0x2b) || (uVar13 == 0x1b)) {
    pPVar8 = QUnicodeTables::properties(L'A');
    uVar11 = 0xf;
    uVar18 = 0xf;
  }
  else {
    uVar11 = 0xf;
    if (uVar13 < 0x2b) {
      uVar11 = (ulong)uVar13;
    }
    uVar18 = (ulong)uVar13;
  }
  uVar28 = uVar18;
  switch(LB::breakTable[uVar11 + (ulong)uVar6 * 0x2b]) {
  case 1:
    goto switchD_0033d462_caseD_1;
  case 2:
switchD_0033d462_caseD_2:
    if (__pred_00.lcls == LineBreak_SP) goto switchD_0033d462_caseD_1;
    break;
  case 3:
    if (__pred_00.lcls != LineBreak_SP) goto LAB_0033d93f;
    goto switchD_0033d462_caseD_1;
  case 4:
    if (__pred_00.lcls != LineBreak_SP) goto LAB_0033d93f;
    break;
  case 5:
    if (__pred_00.lcls != LineBreak_HL) goto switchD_0033d462_caseD_1;
    break;
  case 6:
    uVar13 = (uint)((ulong)*(undefined8 *)pPVar8 >> 0x35) & 7;
    if ((5 < uVar13) || ((0x26U >> uVar13 & 1) == 0)) goto switchD_0033d462_caseD_2;
switchD_0033d462_caseD_1:
    pQVar12[numItems] = (QUnicodeTools)((byte)pQVar12[numItems] | 8);
    break;
  case 7:
    if (uVar7 - 4 < 0xfffffffd) goto switchD_0033d462_caseD_1;
  }
switchD_0033d462_default:
  uVar18 = uVar28;
  uVar13 = (uint)uVar18;
  if ((uVar13 != 0x1b) && (uVar13 != 0x2b)) {
    local_ec = uVar13;
    local_b8 = pPVar8;
  }
LAB_0033d93f:
  pQVar12 = pQVar24 + 1;
  pQVar21 = pQVar17;
  if (pQVar12 == this) goto LAB_0033da3e;
  goto LAB_0033cfc9;
LAB_0033da3e:
  if ((LB::NS::actionTable[(ulong)local_dc * 8] == '\x03') &&
     (pQVar17 = pQVar17 + 1, (long)pQVar17 < (long)this)) {
    do {
      pQVar17[numItems] = (QUnicodeTools)((byte)pQVar17[numItems] & 0xf7);
      pQVar17 = pQVar17 + 1;
    } while (this != pQVar17);
  }
  *(byte *)numItems = *(byte *)numItems & 0x77;
  this[numItems] = (QUnicodeTools)((byte)this[numItems] | 0x88);
LAB_0033da68:
  if (((ulong)attributes & 0x10) != 0) {
    pQVar21 = (QUnicodeTools *)0x0;
    do {
      uVar2 = *(ushort *)(lVar19 + (long)pQVar21 * 2);
      cVar20 = (char32_t)uVar2;
      if ((((cVar20 & 0xfc00U) == 0xd800) && (pQVar21 + 1 != this)) &&
         (uVar7 = (uint)*(ushort *)(lVar19 + 2 + (long)pQVar21 * 2), (uVar7 & 0xfc00) == 0xdc00)) {
        cVar20 = (uint)uVar2 * 0x400 + uVar7 + L'\xfca02400';
        pQVar21 = pQVar21 + 1;
      }
      if ((((uint)(cVar20 + L'\xfffffff7') < 5) || (cVar20 == L' ')) ||
         ((0x7f < (uint)cVar20 &&
          (((cVar20 == L'\x85' || (cVar20 == L'\xa0')) ||
           (bVar4 = QChar::isSpace_helper(cVar20), bVar4)))))) {
        pQVar21[numItems] = (QUnicodeTools)((byte)pQVar21[numItems] | 0x10);
      }
      pQVar21 = pQVar21 + 1;
    } while (pQVar21 != this);
  }
  if (0 < (long)items && string.m_data != (storage_type_conflict *)0x0) {
    pSVar26 = (ScriptItem *)0x0;
    psVar23 = string.m_data;
    do {
      uVar7 = *(int *)(psVar23 + 4) - 0xb;
      if ((uVar7 < 0x16) && ((0x2037ffU >> (uVar7 & 0x1f) & 1) != 0)) {
        pQVar21 = this;
        if ((long)pSVar26 < (long)&items[-1].field_0xf) {
          pQVar21 = *(QUnicodeTools **)(psVar23 + 8);
        }
        (*(code *)(&PTR_indicAttributes_0069c340)[uVar7])
                  (*(int *)(psVar23 + 4),lVar19,*(long *)psVar23,(long)pQVar21 - *(long *)psVar23,
                   numItems);
      }
      pSVar26 = (ScriptItem *)((long)&pSVar26->position + 1);
      psVar23 = psVar23 + 8;
    } while (items != pSVar26);
  }
LAB_0033dae5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void initCharAttributes(QStringView string,
                                      const ScriptItem *items, qsizetype numItems,
                                      QCharAttributes *attributes, CharAttributeOptions options)
{
    if (string.size() <= 0)
        return;

    if (!(options & DontClearAttributes))
        ::memset(attributes, 0, (string.size() + 1) * sizeof(QCharAttributes));

    if (options & GraphemeBreaks)
        getGraphemeBreaks(string.utf16(), string.size(), attributes);
    if (options & WordBreaks)
        getWordBreaks(string.utf16(), string.size(), attributes);
    if (options & SentenceBreaks)
        getSentenceBreaks(string.utf16(), string.size(), attributes);
    if (options & LineBreaks)
        getLineBreaks(string.utf16(), string.size(), attributes, options);
    if (options & WhiteSpaces)
        getWhiteSpaces(string.utf16(), string.size(), attributes);

    if (!qt_initcharattributes_default_algorithm_only) {
        if (!items || numItems <= 0)
            return;

        Tailored::getCharAttributes(string.utf16(), string.size(), items, numItems, attributes);
    }
}